

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::wordVectors(FastText *this)

{
  undefined1 uVar1;
  istream *piVar2;
  Vector *v;
  ostream *this_00;
  Vector *in_RDI;
  FastText *unaff_retaddr;
  Vector vec;
  string word;
  int64_t in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  string local_28 [24];
  string *in_stack_fffffffffffffff0;
  
  std::__cxx11::string::string(local_28);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13a047);
  Vector::Vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,local_28);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!(bool)uVar1) break;
    getVector(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    v = (Vector *)std::operator<<((ostream *)&std::cout,local_28);
    in_stack_ffffffffffffff90 = (Vector *)std::operator<<((ostream *)v," ");
    this_00 = operator<<((ostream *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),v);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  Vector::~Vector(in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void FastText::wordVectors() {
  std::string word;
  Vector vec(args_->dim);
  while (std::cin >> word) {
    getVector(vec, word);
    std::cout << word << " " << vec << std::endl;
  }
}